

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void testing::internal::JsonUnitTestResultPrinter::OutputJsonTestResult
               (ostream *stream,TestResult *result)

{
  string *__return_storage_ptr__;
  TestPartResult *pTVar1;
  ostream *poVar2;
  int line;
  size_t in_RDX;
  size_t width;
  int iVar3;
  internal *this;
  int i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  undefined1 local_a0 [8];
  string message;
  string location;
  undefined1 local_58 [8];
  string kIndent;
  
  Indent_abi_cxx11_((string *)local_58,(internal *)&DAT_0000000a,in_RDX);
  i = 0;
  iVar3 = 0;
  while( true ) {
    line = 0x70;
    if ((int)(((long)(result->test_part_results_).
                     super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)(result->test_part_results_).
                    super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0x70) <= i) break;
    pTVar1 = TestResult::GetTestPartResult(result,i);
    if (pTVar1->type_ - kNonFatalFailure < 2) {
      std::operator<<(stream,",\n");
      if (iVar3 == 0) {
        poVar2 = std::operator<<(stream,(string *)local_58);
        poVar2 = std::operator<<(poVar2,"\"");
        poVar2 = std::operator<<(poVar2,"failures");
        std::operator<<(poVar2,"\": [\n");
      }
      this = (internal *)(pTVar1->file_name_)._M_string_length;
      if (this != (internal *)0x0) {
        this = (internal *)(pTVar1->file_name_)._M_dataplus._M_p;
      }
      __return_storage_ptr__ = (string *)((long)&message.field_2 + 8);
      kIndent.field_2._12_4_ = iVar3;
      FormatCompilerIndependentFileLocation_abi_cxx11_
                (__return_storage_ptr__,this,(char *)(ulong)(uint)pTVar1->line_number_,line);
      std::operator+(&local_c0,__return_storage_ptr__,"\n");
      std::operator+(&local_e0,&local_c0,(pTVar1->message_)._M_dataplus._M_p);
      EscapeJson((string *)local_a0,&local_e0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_c0);
      poVar2 = std::operator<<(stream,(string *)local_58);
      poVar2 = std::operator<<(poVar2,"  {\n");
      poVar2 = std::operator<<(poVar2,(string *)local_58);
      poVar2 = std::operator<<(poVar2,"    \"failure\": \"");
      poVar2 = std::operator<<(poVar2,(string *)local_a0);
      poVar2 = std::operator<<(poVar2,"\",\n");
      poVar2 = std::operator<<(poVar2,(string *)local_58);
      poVar2 = std::operator<<(poVar2,"    \"type\": \"\"\n");
      poVar2 = std::operator<<(poVar2,(string *)local_58);
      std::operator<<(poVar2,"  }");
      iVar3 = kIndent.field_2._12_4_ + 1;
      std::__cxx11::string::~string((string *)local_a0);
      std::__cxx11::string::~string((string *)(message.field_2._M_local_buf + 8));
    }
    i = i + 1;
  }
  if (0 < iVar3) {
    poVar2 = std::operator<<(stream,"\n");
    poVar2 = std::operator<<(poVar2,(string *)local_58);
    std::operator<<(poVar2,"]");
  }
  poVar2 = std::operator<<(stream,"\n");
  Indent_abi_cxx11_((string *)((long)&message.field_2 + 8),(internal *)0x8,width);
  poVar2 = std::operator<<(poVar2,(string *)(message.field_2._M_local_buf + 8));
  std::operator<<(poVar2,"}");
  std::__cxx11::string::~string((string *)(message.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_58);
  return;
}

Assistant:

void JsonUnitTestResultPrinter::OutputJsonTestResult(::std::ostream* stream,
                                                     const TestResult& result) {
  const std::string kIndent = Indent(10);

  int failures = 0;
  for (int i = 0; i < result.total_part_count(); ++i) {
    const TestPartResult& part = result.GetTestPartResult(i);
    if (part.failed()) {
      *stream << ",\n";
      if (++failures == 1) {
        *stream << kIndent << "\"" << "failures" << "\": [\n";
      }
      const std::string location =
          internal::FormatCompilerIndependentFileLocation(part.file_name(),
                                                          part.line_number());
      const std::string message = EscapeJson(location + "\n" + part.message());
      *stream << kIndent << "  {\n"
              << kIndent << "    \"failure\": \"" << message << "\",\n"
              << kIndent << "    \"type\": \"\"\n"
              << kIndent << "  }";
    }
  }

  if (failures > 0)
    *stream << "\n" << kIndent << "]";
  *stream << "\n" << Indent(8) << "}";
}